

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonObjectStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  char c;
  u32 N;
  JsonString *p;
  char *zIn;
  
  if ((short)ctx->pMem->flags < 0) {
    p = (JsonString *)ctx->pMem->z;
  }
  else {
    p = (JsonString *)createAggContext(ctx,0x88);
  }
  if (p == (JsonString *)0x0) {
    return;
  }
  if (p->zBuf == (char *)0x0) {
    p->pCtx = ctx;
    p->zBuf = p->zSpace;
    p->nAlloc = 100;
    p->nUsed = 0;
    p->bStatic = '\x01';
    p->bErr = '\0';
    c = '{';
  }
  else {
    c = ',';
    if (p->nUsed < 2) goto LAB_0019fb86;
  }
  jsonAppendChar(p,c);
LAB_0019fb86:
  p->pCtx = ctx;
  zIn = (char *)sqlite3ValueText(*argv,'\x01');
  N = sqlite3ValueBytes(*argv,'\x01');
  jsonAppendString(p,zIn,N);
  jsonAppendChar(p,':');
  jsonAppendValue(p,argv[1]);
  return;
}

Assistant:

static void jsonObjectStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  const char *z;
  u32 n;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonInit(pStr, ctx);
      jsonAppendChar(pStr, '{');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    z = (const char*)sqlite3_value_text(argv[0]);
    n = (u32)sqlite3_value_bytes(argv[0]);
    jsonAppendString(pStr, z, n);
    jsonAppendChar(pStr, ':');
    jsonAppendValue(pStr, argv[1]);
  }
}